

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

RC __thiscall
SM_Manager::CreateTable(SM_Manager *this,char *relName,int attrCount,AttrInfo *attributes)

{
  char *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  ostream *poVar4;
  size_t sVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  char *local_128;
  char *local_120;
  AttrInfo attr;
  int i_2;
  int currOffset;
  RID rid;
  _Self local_c8;
  _Self local_c0;
  undefined1 local_b2;
  allocator local_b1;
  undefined1 local_b0 [6];
  bool exists;
  string attrString;
  int local_80;
  int local_7c;
  int i_1;
  int totalRecSize;
  undefined1 local_68 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relAttributes;
  RC rc;
  int i;
  AttrInfo *attributes_local;
  int attrCount_local;
  char *relName_local;
  SM_Manager *this_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"CreateTable\n");
  poVar4 = std::operator<<(poVar4,"   relName     =");
  poVar4 = std::operator<<(poVar4,relName);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"   attrCount   =");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,attrCount);
  std::operator<<(poVar4,"\n");
  for (relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < attrCount;
      relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"   attributes[");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_)
    ;
    poVar4 = std::operator<<(poVar4,"].attrName=");
    poVar4 = std::operator<<(poVar4,attributes
                                    [relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                     _4_4_].attrName);
    poVar4 = std::operator<<(poVar4,"   attrType=");
    if (attributes[relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].attrType ==
        INT) {
      local_120 = "INT";
    }
    else {
      if (attributes[relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].attrType
          == MBR) {
        local_128 = "MBR";
      }
      else {
        local_128 = "STRING";
        if (attributes[relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].
            attrType == FLOAT) {
          local_128 = "FLOAT";
        }
      }
      local_120 = local_128;
    }
    poVar4 = std::operator<<(poVar4,local_120);
    poVar4 = std::operator<<(poVar4,"   attrLength=");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,attributes
                               [relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
                               ].attrLength);
    std::operator<<(poVar4,"\n");
  }
  relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_68);
  if ((attrCount < 0x29) && (0 < attrCount)) {
    sVar5 = strlen(relName);
    if (sVar5 < 0x19) {
      local_7c = 0;
      for (local_80 = 0; local_80 < attrCount; local_80 = local_80 + 1) {
        sVar5 = strlen(attributes[local_80].attrName);
        if (0x18 < sVar5) {
          this_local._4_4_ = 0x130;
          goto LAB_0010b427;
        }
        attrString.field_2._8_8_ = attributes[local_80].attrName;
        bVar3 = isValidAttrType(this,attributes[local_80]);
        if (!bVar3) {
          this_local._4_4_ = 0x130;
          goto LAB_0010b427;
        }
        local_7c = local_7c + attributes[local_80].attrLength;
        pcVar1 = attributes[local_80].attrName;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_b0,pcVar1,&local_b1);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        local_c0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68,(key_type *)local_b0);
        local_c8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68);
        local_b2 = std::operator!=(&local_c0,&local_c8);
        bVar3 = !(bool)local_b2;
        if (bVar3) {
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_68,(value_type *)local_b0);
          rid = (RID)pVar6.first._M_node;
        }
        else {
          this_local._4_4_ = 0x12f;
        }
        std::__cxx11::string::~string((string *)local_b0);
        if (!bVar3) goto LAB_0010b427;
      }
      relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           RM_Manager::CreateFile(this->rmm,relName,local_7c);
      if ((RC)relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        RID::RID((RID *)&i_2);
        attr.attrLength = 0;
        for (attr.attrType = INT; (int)attr.attrType < attrCount;
            attr.attrType = attr.attrType + FLOAT) {
          uVar2 = attributes[(int)attr.attrType].attrLength;
          relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
               InsertAttrCat(this,relName,attributes[(int)attr.attrType],attr.attrLength,
                             attr.attrType);
          this_local._4_4_ = (RC)relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count;
          if ((RC)relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
          goto LAB_0010b41b;
          attr.attrLength = uVar2 + attr.attrLength;
          relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
        }
        relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             InsertRelCat(this,relName,attrCount,local_7c);
        this_local._4_4_ = (RC)relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if ((RC)relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
               RM_FileHandle::ForcePages(&this->attrcatFH,-1);
          if (((RC)relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
             (relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
                   RM_FileHandle::ForcePages(&this->relcatFH,-1),
             (RC)relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
            this_local._4_4_ = 0;
          }
          else {
            this_local._4_4_ = (RC)relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count;
          }
        }
LAB_0010b41b:
        RID::~RID((RID *)&i_2);
      }
      else {
        this_local._4_4_ = 0x12e;
      }
    }
    else {
      this_local._4_4_ = 0x12e;
    }
  }
  else {
    printf("reaches here\n");
    this_local._4_4_ = 0x12f;
  }
LAB_0010b427:
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_68);
  return this_local._4_4_;
}

Assistant:

RC SM_Manager::CreateTable(const char *relName,
                           int        attrCount,
                           AttrInfo   *attributes)
{
  cout << "CreateTable\n"
    << "   relName     =" << relName << "\n"
    << "   attrCount   =" << attrCount << "\n";
  for (int i = 0; i < attrCount; i++)
    cout << "   attributes[" << i << "].attrName=" << attributes[i].attrName
        << "   attrType="
        << (attributes[i].attrType == INT ? "INT" :
            attributes[i].attrType == MBR ? "MBR" :
            attributes[i].attrType == FLOAT ? "FLOAT" : "STRING")
        << "   attrLength=" << attributes[i].attrLength << "\n";

  RC rc = 0;
  set<string> relAttributes;

  // Check for appropraite # of attributes
  if(attrCount > MAXATTRS || attrCount < 1){
    printf("reaches here\n");
    return (SM_BADREL);
  }
  if(strlen(relName) > MAXNAME) // Check for valid relName size
    return (SM_BADRELNAME);

  // Check the attribute specifications
  int totalRecSize = 0;
  for(int i = 0; i < attrCount; i++){
    if(strlen(attributes[i].attrName) > MAXNAME) // check name size
      return (SM_BADATTR);
    if(! isValidAttrType(attributes[i])) // check type
      return (SM_BADATTR);
    totalRecSize += attributes[i].attrLength; 
    string attrString(attributes[i].attrName); // check attribute dups
    bool exists = (relAttributes.find(attrString) != relAttributes.end());
    if(exists)
      return (SM_BADREL);
    else
      relAttributes.insert(attrString);
  }

  // Passed error check. Now information in relcat and attrcat

  // Create a file for this relation. This will check for duplicate tables
  // of the same name.
  if((rc = rmm.CreateFile(relName, totalRecSize)))
    return (SM_BADRELNAME);

  // For each attribute, insert into attrcat:
  RID rid;
  int currOffset = 0;
  for(int i = 0; i < attrCount; i++){
    AttrInfo attr = attributes[i];
    if((rc = InsertAttrCat(relName, attr, currOffset, i)))
      return (rc);
    currOffset += attr.attrLength;
  }
    
  // Insert into RelCat
  if((rc = InsertRelCat(relName, attrCount, totalRecSize)))
    return (rc);

  // Make sure changes to attrcat and relcat are reflected
  if((rc = attrcatFH.ForcePages()) || (rc = relcatFH.ForcePages()))
    return (rc);

  return (0);
}